

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeNN.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  NaException *ex;
  char prompt [100];
  uint iLayer;
  char szHidLayNumQuestion [100];
  NaConfigPart *conf_list [1];
  NaNNUnit nnu;
  NaConfigFile nnfile;
  NaNeuralNetDescr nnd;
  char defnname [10];
  char *nname;
  char deffname [7];
  char *fname;
  char **args;
  int argn;
  char *local_c88;
  char local_c68 [108];
  uint local_bfc;
  char local_bf8 [112];
  char *local_b88;
  NaNNUnit local_b80 [32];
  char local_b60 [1488];
  NaConfigFile local_590 [8];
  undefined1 auStack_588 [1184];
  NaNeuralNetDescr local_e8 [40];
  uint local_c0;
  uint auStack_bc [10];
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  char local_48 [16];
  undefined8 local_38;
  char local_30 [8];
  char *local_28;
  undefined8 *local_20;
  uint local_14;
  undefined8 *local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = in_EDI - 1;
  local_20 = in_RSI + 1;
  builtin_strncpy(local_30,"new.nn",7);
  builtin_strncpy(local_48,"Undefined",10);
  local_10 = in_RSI;
  reset_rand();
  NaNeuralNetDescr::NaNeuralNetDescr(local_e8,1,1);
  NaConfigFile::NaConfigFile(local_590,";NeuCon NeuralNet",1,1,".cna","[ ] ;");
  uVar3 = NaConfigFile::Magic();
  printf("Neural network maker %s\n",uVar3);
  printf("Usage: %s [File.nn [NameOfNN [InDim [InRep [OutDim\n       [OutRep [Feedback [OutAct [HidNum [Hid0 Hid1...]]]]]\n"
         ,*local_10);
  if ((int)local_14 < 1) {
    local_28 = (char *)ask_user_name("Target filename",local_30);
  }
  else {
    local_14 = local_14 - 1;
    local_28 = (char *)*local_20;
    local_20 = local_20 + 1;
    printf("Target filename: %s\n",local_28);
  }
  NaNNUnit::NaNNUnit(local_b80,local_e8);
  local_c88 = (char *)0x0;
  if (&stack0x00000000 != (undefined1 *)0xb80) {
    local_c88 = local_b60;
  }
  local_b88 = local_c88;
  NaConfigFile::AddPartitions((int)auStack_588 - 8,(NaConfigPart **)0x1);
  iVar1 = access(local_28,0);
  if (iVar1 == 0) {
    printf("Changing NN file \'%s\'\n",local_28);
    NaConfigFile::LoadFromFile((char *)local_590);
  }
  else {
    printf("Creating new NN file \'%s\'\n",local_28);
  }
  if ((int)local_14 < 1) {
    local_38 = ask_user_name("Name of NN instance",local_48);
  }
  else {
    local_14 = local_14 - 1;
    local_38 = *local_20;
    local_20 = local_20 + 1;
    printf("Name of NN instance: %s\n",local_38);
  }
  NaConfigPart::SetInstance(local_b60);
  if ((int)local_14 < 1) {
    local_94 = ask_user_int("Input dimension",local_94);
  }
  else {
    local_14 = local_14 - 1;
    local_94 = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("Input dimension: %d\n",(ulong)local_94);
  }
  if ((int)local_14 < 1) {
    local_90 = ask_user_int("Input repeats",local_90);
  }
  else {
    local_14 = local_14 - 1;
    local_90 = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("Input repeats: %d\n",(ulong)local_90);
  }
  if ((int)local_14 < 1) {
    local_84 = ask_user_int("Output dimension",local_84);
  }
  else {
    local_14 = local_14 - 1;
    local_84 = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("Output dimension: %d\n",(ulong)local_84);
  }
  if ((int)local_14 < 1) {
    local_8c = ask_user_int("Output repeats",local_8c);
  }
  else {
    local_14 = local_14 - 1;
    local_8c = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("Output repeats: %d\n",(ulong)local_8c);
  }
  if ((int)local_14 < 1) {
    local_88 = ask_user_int("Feedback depth",local_88);
  }
  else {
    local_14 = local_14 - 1;
    local_88 = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("Feedback depth: %d\n",(ulong)local_88);
  }
  if ((int)local_14 < 1) {
    local_80 = ask_user_int("Output activation (0-linear; 1-sigmoid)",local_80);
  }
  else {
    local_14 = local_14 - 1;
    local_80 = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("Output activation (0-linear; 1-sigmoid): %d\n",(ulong)local_80);
  }
  sprintf(local_bf8,"Number of hidden layers (0-%u)",10);
  if ((int)local_14 < 1) {
    local_c0 = ask_user_int(local_bf8,local_c0);
  }
  else {
    local_14 = local_14 - 1;
    local_c0 = atoi((char *)*local_20);
    local_20 = local_20 + 1;
    printf("%s: %u\n",local_bf8,(ulong)local_c0);
  }
  if (10 < local_c0) {
    printf("Not more than %u layers are allowed.\n",10);
    local_c0 = 10;
  }
  for (local_bfc = 0; local_bfc < local_c0; local_bfc = local_bfc + 1) {
    if (local_bfc < local_14) {
      uVar2 = atoi((char *)local_20[local_bfc]);
      auStack_bc[local_bfc] = uVar2;
      printf("Hidden layer #%u: %d\n",(ulong)local_bfc,(ulong)auStack_bc[local_bfc]);
    }
    else {
      sprintf(local_c68,"Hidden layer #%u",(ulong)local_bfc);
      uVar2 = ask_user_int(local_c68,auStack_bc[local_bfc]);
      auStack_bc[local_bfc] = uVar2;
    }
  }
  NaNNUnit::AssignDescr((NaNeuralNetDescr *)local_b80);
  NaNNUnit::Initialize();
  NaConfigFile::SaveToFile((char *)local_590);
  NaNNUnit::~NaNNUnit(local_b80);
  NaConfigFile::~NaConfigFile(local_590);
  NaNeuralNetDescr::~NaNeuralNetDescr(local_e8);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  int     argn = argc - 1;
  char    **args = argv + 1;
  char    *fname, deffname[] = "new.nn";
  char    *nname, defnname[] = "Undefined";

  reset_rand();

  try{
    NaNeuralNetDescr    nnd;    // Default NN description 
    NaConfigFile        nnfile(";NeuCon NeuralNet", 1, 1);

    printf("Neural network maker %s\n", nnfile.Magic());
    printf("Usage: %s [File.nn [NameOfNN [InDim [InRep [OutDim\n"
	   "       [OutRep [Feedback [OutAct [HidNum [Hid0 Hid1...]]]]]\n",
	   argv[0]);

    if(argn > 0)
      {
	--argn;		/* used argument */
	fname = args[0];  ++args;
	printf("Target filename: %s\n", fname);
      }
    else
      fname = ask_user_name("Target filename", deffname);

    // Some default NN description
    NaNNUnit            nnu(nnd);

    NaConfigPart        *conf_list[] = { &nnu };
    nnfile.AddPartitions(NaNUMBER(conf_list), conf_list);

    // Check for existant file
    if(!access(fname, F_OK)){
        // File is exist
        printf("Changing NN file '%s'\n", fname);

        // Read neural network from file
        nnfile.LoadFromFile(fname);
    }else{
        // New file
        printf("Creating new NN file '%s'\n", fname);
    }

    if(argn > 0)
      {
	--argn;		/* used argument */
	nname = args[0];  ++args;
	printf("Name of NN instance: %s\n", nname);
      }
    else
      nname = ask_user_name("Name of NN instance", defnname);

    nnu.SetInstance(nname);

    // Ask for NN description
    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nInputsNumber = atoi(args[0]);  ++args;
	printf("Input dimension: %d\n", nnd.nInputsNumber);
      }
    else
      nnd.nInputsNumber = ask_user_int("Input dimension",
				       nnd.nInputsNumber);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nInputsRepeat = atoi(args[0]);  ++args;
	printf("Input repeats: %d\n", nnd.nInputsRepeat);
      }
    else
      nnd.nInputsRepeat = ask_user_int("Input repeats",
				       nnd.nInputsRepeat);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nOutNeurons = atoi(args[0]);  ++args;
	printf("Output dimension: %d\n", nnd.nOutNeurons);
      }
    else
      nnd.nOutNeurons = ask_user_int("Output dimension",
				     nnd.nOutNeurons);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nOutputsRepeat = atoi(args[0]);  ++args;
	printf("Output repeats: %d\n", nnd.nOutputsRepeat);
      }
    else
      nnd.nOutputsRepeat = ask_user_int("Output repeats",
					nnd.nOutputsRepeat);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nFeedbackDepth = atoi(args[0]);  ++args;
	printf("Feedback depth: %d\n", nnd.nFeedbackDepth);
      }
    else
      nnd.nFeedbackDepth = ask_user_int("Feedback depth",
					nnd.nFeedbackDepth);

    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.eLastActFunc = (NaActFuncKind) atoi(args[0]);  ++args;
	printf("Output activation (0-linear; 1-sigmoid): %d\n",
	       nnd.eLastActFunc);
      }
    else
      nnd.eLastActFunc =
        (NaActFuncKind) ask_user_int("Output activation (0-linear; 1-sigmoid)",
				     nnd.eLastActFunc);

    char szHidLayNumQuestion[100];
    sprintf(szHidLayNumQuestion, "Number of hidden layers (0-%u)", NaMAX_HIDDEN);
    if(argn > 0)
      {
	--argn;		/* used argument */
	nnd.nHidLayers = atoi(args[0]);  ++args;
	printf("%s: %u\n", szHidLayNumQuestion, nnd.nHidLayers);
      }
    else
      nnd.nHidLayers = ask_user_int(szHidLayNumQuestion, nnd.nHidLayers);

    if(nnd.nHidLayers > NaMAX_HIDDEN){
        printf("Not more than %u layers are allowed.\n", NaMAX_HIDDEN);
        nnd.nHidLayers = NaMAX_HIDDEN;
    }

    unsigned    iLayer;
    for(iLayer = 0; iLayer < nnd.nHidLayers; ++iLayer){
        // Ask for number of neurons in given layer
	if(argn > iLayer)
	  {
	    nnd.nHidNeurons[iLayer] = atoi(args[iLayer]);
	    printf("Hidden layer #%u: %d\n", iLayer, nnd.nHidNeurons[iLayer]);
	  }
	else
	  {
	    char    prompt[100];
	    sprintf(prompt, "Hidden layer #%u", iLayer);
	    nnd.nHidNeurons[iLayer] = ask_user_int(prompt,
						   nnd.nHidNeurons[iLayer]);
	  }
    }

    nnu.AssignDescr(nnd);

    nnu.Initialize();

    // Store neural network to file
    nnfile.SaveToFile(fname);
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}